

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
assemble_columns_to_reduce
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,index_t dimension,pivot_column_index_t *pivot_column_index)

{
  iterator *piVar1;
  ulong uVar2;
  unsigned_long uVar3;
  _Elt_pointer piVar4;
  directed_flag_complex_computer_t *pdVar5;
  pair<float,_int> *ppVar6;
  ostream *poVar7;
  long lVar8;
  filtered_directed_graph_t *pfVar9;
  vector<float,_std::allocator<float>_> *pvVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  float fVar19;
  pair<float,_int> local_38;
  
  uVar3 = (this->complex->cell_count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(long)dimension + 1];
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::clear
            (&this->columns_to_reduce);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"assembling ",0xb);
  uVar17 = (uint)uVar3;
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,uVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," columns",8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\r",1);
  if (0 < (int)uVar17) {
    iVar15 = -1;
    uVar13 = 1;
    lVar18 = 0;
    lVar12 = 0;
    uVar16 = 0;
    do {
      piVar4 = (pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      lVar8 = (long)piVar4 -
              (long)(pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 2;
      uVar2 = uVar16 + lVar8;
      if (uVar2 < 0x80) {
        piVar11 = (int *)((long)piVar4 + lVar12);
      }
      else {
        uVar14 = (uVar2 >> 7) + 0xfe00000000000000;
        if (0 < (long)uVar2) {
          uVar14 = uVar2 >> 7;
        }
        piVar11 = (pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar14] + lVar8 + uVar14 * -0x80 + uVar16;
      }
      if (*piVar11 == 0x7fffffff) {
        pdVar5 = this->complex;
        if (pdVar5->filtration_algorithm == (filtration_algorithm_t *)0x0) {
          fVar19 = 0.0;
        }
        else {
          if (dimension == 0) {
            pfVar9 = pdVar5->graph;
            lVar8 = 0xc0;
LAB_00140343:
            pvVar10 = (vector<float,_std::allocator<float>_> *)
                      ((long)&(pfVar9->super_directed_graph_t).number_of_vertices + lVar8);
          }
          else {
            if (dimension == -1) {
              pfVar9 = pdVar5->graph;
              lVar8 = 0xa8;
              goto LAB_00140343;
            }
            pvVar10 = &pdVar5->next_filtration;
          }
          fVar19 = *(float *)((long)(pvVar10->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar12);
        }
        if (fVar19 <= this->max_filtration) {
          local_38 = (pair<float,_int>)((ulong)(uint)fVar19 + lVar18);
          ppVar6 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar6 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_push_back_aux<filtration_index_t>
                      (&this->columns_to_reduce,(filtration_index_t *)&local_38);
          }
          else {
            *ppVar6 = local_38;
            piVar1 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        if ((uVar13 / 100000) * 100000 + iVar15 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"assembled ",10);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," out of ",8);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar16 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," columns",8);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\r",1);
        }
      }
      uVar16 = uVar16 + 1;
      lVar12 = lVar12 + 4;
      lVar18 = lVar18 + 0x100000000;
      iVar15 = iVar15 + -1;
      uVar13 = uVar13 + 1;
    } while ((uVar17 & 0x7fffffff) != uVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  return;
}

Assistant:

void assemble_columns_to_reduce(index_t dimension, pivot_column_index_t& pivot_column_index) {
		index_t num_cells = index_t(complex.number_of_cells(dimension + 1));

		columns_to_reduce.clear();

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "assembling " << num_cells << " columns" << std::flush << "\r";
#endif

		for (index_t index = 0; index < num_cells; ++index) {
			if (
#ifdef USE_ARRAY_HASHMAP
			    pivot_column_index[index] == INVALID_INDEX
#else
			    pivot_column_index.find(index) == pivot_column_index.end()
#endif
			) {
				value_t filtration = complex.filtration(dimension + 1, index);
				if (filtration <= max_filtration) { columns_to_reduce.push_back(std::make_pair(filtration, index)); }
#ifdef INDICATE_PROGRESS
				if ((index + 1) % 100000 == 0)
					std::cout << "\033[K"
					          << "assembled " << columns_to_reduce.size() << " out of " << (index + 1) << "/"
					          << num_cells << " columns" << std::flush << "\r";
#endif
			}
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}